

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

size_t __thiscall SimpleString::count(SimpleString *this,SimpleString *substr)

{
  char *s2;
  char *pcVar1;
  size_t sVar2;
  
  pcVar1 = this->buffer_;
  s2 = substr->buffer_;
  sVar2 = 0;
  while( true ) {
    if (*pcVar1 == '\0') {
      return sVar2;
    }
    pcVar1 = StrStr(pcVar1,s2);
    if (pcVar1 == (char *)0x0) break;
    pcVar1 = pcVar1 + 1;
    sVar2 = sVar2 + 1;
  }
  return sVar2;
}

Assistant:

const char* SimpleString::getBuffer() const
{
    return buffer_;
}